

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifresearch(bifcxdef *ctx,int argc)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  undefined4 in_ESI;
  runsdef *in_RDI;
  runsdef *unaff_retaddr;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uchar *p;
  runsdef val;
  ushort listsiz;
  int match_ofs;
  int result_len;
  size_t searchlen;
  uchar *searchstr;
  size_t patlen;
  uchar *patstr;
  undefined8 in_stack_ffffffffffffff98;
  runcxdef *in_stack_ffffffffffffffa0;
  runcxdef *ctx_00;
  size_t in_stack_ffffffffffffffa8;
  uchar in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  anon_union_8_4_1dda36f5_for_runsv in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  lVar1 = *(long *)((in_RDI->runsv).runsvnum + 0x20);
  *(long *)((in_RDI->runsv).runsvnum + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x03') {
    *(undefined4 *)(**(long **)(in_RDI->runsv).runsvstr + 0x68) = 0;
    runsign(in_stack_ffffffffffffffa0,iVar3);
  }
  ctx_00 = *(runcxdef **)(*(long *)((in_RDI->runsv).runsvnum + 0x20) + 8);
  osrp2(ctx_00);
  lVar1 = *(long *)((in_RDI->runsv).runsvnum + 0x20);
  *(long *)((in_RDI->runsv).runsvnum + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) == '\x03') {
    osrp2(*(void **)(*(long *)((in_RDI->runsv).runsvnum + 0x20) + 8));
    iVar3 = re_compile_and_search
                      ((re_context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (char *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8.runsvnum,
                       (char *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(int *)ctx_00);
    if (iVar3 < 0) {
      runpnil(ctx_00);
    }
    else {
      uVar2 = (short)in_stack_ffffffffffffffcc + 0xf;
      if ((uint)((int)*(undefined8 *)((in_RDI->runsv).runsvnum + 0x40) -
                (int)*(undefined8 *)((in_RDI->runsv).runsvnum + 0x38)) <= (uint)uVar2) {
        runhcmp((runcxdef *)p,in_stack_0000000c,in_stack_00000008,unaff_retaddr,in_RDI,
                (runsdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      }
      pvVar5 = *(void **)((in_RDI->runsv).runsvnum + 0x38);
      oswp2(pvVar5,(uint)uVar2);
      pvVar4 = (void *)((long)pvVar5 + 3);
      *(undefined1 *)((long)pvVar5 + 2) = 1;
      oswp4s(pvVar4,(long)(iVar3 + 1));
      pvVar5 = (void *)((long)pvVar4 + 5);
      *(undefined1 *)((long)pvVar4 + 4) = 1;
      oswp4s(pvVar5,(long)in_stack_ffffffffffffffcc);
      pvVar4 = (void *)((long)pvVar5 + 5);
      *(undefined1 *)((long)pvVar5 + 4) = 3;
      oswp2(pvVar4,in_stack_ffffffffffffffcc + 2);
      memcpy((void *)((long)pvVar4 + 2),in_RDI[0x1a].runsv.runsvstr + iVar3,
             (long)in_stack_ffffffffffffffcc);
      *(long *)((in_RDI->runsv).runsvnum + 0x38) =
           *(long *)((in_RDI->runsv).runsvnum + 0x38) + (long)(int)(uint)uVar2;
      runrepush((runcxdef *)(in_RDI->runsv).runsvstr,(runsdef *)&stack0xffffffffffffffb0);
    }
    return;
  }
  *(undefined4 *)(**(long **)(in_RDI->runsv).runsvstr + 0x68) = 0;
  runsign(ctx_00,iVar3);
}

Assistant:

void bifresearch(bifcxdef *ctx, int argc)
{
    uchar  *patstr;
    size_t  patlen;
    uchar  *searchstr;
    size_t  searchlen;
    int     result_len;
    int     match_ofs;
    
    /* this function takes two parameters: pattern, string */
    bifcntargs(ctx, 2, argc);

    /* get the pattern string */
    patstr = runpopstr(ctx->bifcxrun);
    patlen = osrp2(patstr) - 2;
    patstr += 2;

    /* get the search string */
    searchstr = runpopstr(ctx->bifcxrun);
    searchlen = osrp2(searchstr) - 2;
    searchstr += 2;

    /* search for the pattern in the string */
    match_ofs = re_compile_and_search(&ctx->bifcxregex,
                                      (char *)patstr, patlen,
                                      (char *)searchstr, searchlen,
                                      &result_len);

    /* 
     *   if we didn't match, return nil; otherwise, return a list with the
     *   match offset and length 
     */
    if (match_ofs < 0)
    {
        /* no match - return nil */
        runpnil(ctx->bifcxrun);
    }
    else
    {
        ushort listsiz;
        runsdef val;
        uchar *p;
        
        /* 
         *   build a list consisting of two numbers and a string: two
         *   bytes for the list header, then two elements at (one byte for
         *   the datatype header, four bytes for the number), then the
         *   string element with (one byte for the datatype, two bytes for
         *   the string length prefix, and the bytes of the string) 
         */
        listsiz = 2 + (1+4)*2 + (1 + 2 + (ushort)(result_len));

        /* allocate the space */
        runhres(ctx->bifcxrun, listsiz, 0);

        /* set up the list stack item */
        val.runstyp = DAT_LIST;
        p = val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

        /* set the list's length */
        oswp2(p, listsiz);
        p += 2;

        /* 
         *   Add the offset element.  For consistency with TADS
         *   conventions, use 1 as the offset of the first character in
         *   the string - this makes it easy to use the offset value with
         *   substr(). 
         */
        *p++ = DAT_NUMBER;
        oswp4s(p, match_ofs + 1);
        p += 4;

        /* add the length element */
        *p++ = DAT_NUMBER;
        oswp4s(p, result_len);
        p += 4;

        /* add the result string */
        *p++ = DAT_SSTRING;
        oswp2(p, result_len + 2);
        p += 2;
        memcpy(p, ctx->bifcxregex.strbuf + match_ofs, result_len);

        /* reserve the space in the heap */
        ctx->bifcxrun->runcxhp += listsiz;

        /* return the list */
        runrepush(ctx->bifcxrun, &val);
    }
}